

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_1::parseAttributeValues
               (EGLint *attribList,EGLint *majorVersion,EGLint *minorVersion,EGLint *robustAccessExt
               )

{
  int iVar1;
  int *local_30;
  EGLint *iter;
  EGLint *robustAccessExt_local;
  EGLint *minorVersion_local;
  EGLint *majorVersion_local;
  EGLint *attribList_local;
  
  local_30 = attribList;
  while (*local_30 != 0x3038) {
    iVar1 = *local_30;
    if (iVar1 == 0x3098) {
      *majorVersion = local_30[1];
      local_30 = local_30 + 2;
    }
    else if (iVar1 == 0x30bf) {
      *robustAccessExt = local_30[1];
      local_30 = local_30 + 2;
    }
    else if (iVar1 == 0x30fb) {
      *minorVersion = local_30[1];
      local_30 = local_30 + 2;
    }
    else if (iVar1 == 0x3138) {
      local_30 = local_30 + 2;
    }
  }
  return;
}

Assistant:

void parseAttributeValues (const EGLint* attribList, EGLint& majorVersion, EGLint& minorVersion, EGLint& robustAccessExt)
{
	const EGLint* iter = attribList;

	while ((*iter) != EGL_NONE)
	{
		switch (*iter)
		{
			case EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT:
				iter++;
				robustAccessExt = *iter;
				iter++;
				break;

			case EGL_CONTEXT_MAJOR_VERSION_KHR:
				iter++;
				majorVersion = (*iter);
				iter++;
				break;

			case EGL_CONTEXT_MINOR_VERSION_KHR:
				iter++;
				minorVersion = (*iter);
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT:
				iter++;
				iter++;
				break;

			default:
				DE_FATAL("Unsupported EGL attribute");
		}
	}
}